

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall
QWizardPage::registerField
          (QWizardPage *this,QString *name,QWidget *widget,char *property,char *changedSignal)

{
  long lVar1;
  long in_FS_OFFSET;
  QWizardField field;
  undefined1 local_98 [40];
  QObject *pQStack_70;
  QArrayData *local_68;
  char *pcStack_60;
  undefined1 *local_58;
  QArrayData *pQStack_50;
  char *local_48;
  undefined1 *puStack_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined1 *puStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWizardField::QWizardField
            ((QWizardField *)local_98,this,name,&widget->super_QObject,property,changedSignal);
  if (*(long *)(lVar1 + 600) == 0) {
    QtPrivate::QMovableArrayOps<QWizardField>::emplace<QWizardField_const&>
              ((QMovableArrayOps<QWizardField> *)(lVar1 + 0x2f0),*(qsizetype *)(lVar1 + 0x300),
               (QWizardField *)local_98);
    QList<QWizardField>::end((QList<QWizardField> *)(lVar1 + 0x2f0));
  }
  else {
    QWizardPrivate::addField
              (*(QWizardPrivate **)(*(long *)(lVar1 + 600) + 8),(QWizardField *)local_98);
  }
  ::QVariant::~QVariant((QVariant *)&local_38);
  if (pQStack_50 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_50,1,0x10);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,1,0x10);
    }
  }
  if ((QArrayData *)local_98._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._8_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPage::registerField(const QString &name, QWidget *widget, const char *property,
                                const char *changedSignal)
{
    Q_D(QWizardPage);
    QWizardField field(this, name, widget, property, changedSignal);
    if (d->wizard) {
        d->wizard->d_func()->addField(field);
    } else {
        d->pendingFields += field;
    }
}